

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySortTree.c
# Opt level: O1

int InsertBST(BiTree *T,int key)

{
  int iVar1;
  BiTree pBVar2;
  int iVar3;
  BiTree p;
  BiTree local_20;
  
  iVar3 = 0;
  iVar1 = SearchBST(*T,key,(BiTree)0x0,&local_20);
  if (iVar1 == 0) {
    pBVar2 = (BiTree)malloc(0x18);
    pBVar2->data = key;
    pBVar2->lChild = (BiTNode *)0x0;
    pBVar2->rChlid = (BiTNode *)0x0;
    if (local_20 != (BiTree)0x0) {
      if (key < local_20->data) {
        T = &local_20->lChild;
      }
      else {
        T = &local_20->rChlid;
      }
    }
    *T = pBVar2;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int InsertBST(BiTree *T,int key){
     BiTree p,s;
     if(!SearchBST(*T,key,NULL,&p)){        //没找到key
         s = (BiTree)malloc(sizeof(BiTNode));
         s->data = key;
         s->lChild = s->rChlid = NULL;  //新结点初始化

         if(!p)
             *T = s; //插入s为新的根节点
         else if(key < p->data)
             p->lChild = s;     //插入s为左孩子
         else
             p->rChlid = s;     //插入s为右孩子
         return 1;
     } else
         return 0;
 }